

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderAllowZeroesTestissue176::runTestCase(TestCharReaderAllowZeroesTestissue176 *this)

{
  TestResult *pTVar1;
  int iVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  CharReader *pCVar5;
  allocator local_169;
  Value local_168;
  string local_140;
  Value root;
  string errs;
  char doc [20];
  CharReaderBuilder b;
  Value local_90;
  Value local_68;
  Value local_40;
  
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  Json::Value::Value(&local_40,true);
  pVVar4 = Json::Value::operator[](&b.settings_,"allowSingleQuotes");
  Json::Value::operator=(pVVar4,&local_40);
  Json::Value::~Value(&local_40);
  Json::Value::Value(&root,nullValue);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  pCVar5 = Json::CharReaderBuilder::newCharReader(&b);
  builtin_strncpy(doc,"{\'a\':true,\"b\":true}",0x14);
  iVar2 = (*pCVar5->_vptr_CharReader[2])(pCVar5,doc,doc + 0x13,&root,&errs);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowZeroesTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x8b3,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_168,"",&local_169);
  std::__cxx11::string::string((string *)&local_140,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_168,&local_140,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b4,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_168);
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  AVar3 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,2,AVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b5,"2u == root.size()");
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  Json::Value::Value(&local_168,false);
  Json::Value::get(&local_68,&root,"a",&local_168);
  JsonTest::checkEqual<bool,Json::Value>
            (pTVar1,true,&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b6,"true == root.get(\"a\", false)");
  Json::Value::~Value(&local_68);
  Json::Value::~Value(&local_168);
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  Json::Value::Value(&local_168,false);
  Json::Value::get(&local_90,&root,"b",&local_168);
  JsonTest::checkEqual<bool,Json::Value>
            (pTVar1,true,&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8b7,"true == root.get(\"b\", false)");
  Json::Value::~Value(&local_90);
  Json::Value::~Value(&local_168);
  builtin_strncpy(doc,"{\'a\': \'x\', \"b\":\'y\'}",0x14);
  iVar2 = (*pCVar5->_vptr_CharReader[2])(pCVar5,doc,doc + 0x13,&root,&errs);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowZeroesTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x8be,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_168,"",&local_169);
  std::__cxx11::string::string((string *)&local_140,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_168,&local_140,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8bf,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_168);
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  AVar3 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,2,AVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8c0,"2u == root.size()");
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_168,"x",&local_169);
  pVVar4 = Json::Value::operator[](&root,"a");
  Json::Value::asString_abi_cxx11_(&local_140,pVVar4);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_168,&local_140,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8c1,"\"x\" == root[\"a\"].asString()");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_168);
  pTVar1 = (this->super_CharReaderAllowZeroesTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_168,"y",&local_169);
  pVVar4 = Json::Value::operator[](&root,"b");
  Json::Value::asString_abi_cxx11_(&local_140,pVVar4);
  JsonTest::checkStringEqual
            (pTVar1,(string *)&local_168,&local_140,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x8c2,"\"y\" == root[\"b\"].asString()");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::~Value(&root);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderAllowZeroesTest, issue176) {
  Json::CharReaderBuilder b;
  b.settings_["allowSingleQuotes"] = true;
  Json::Value root;
  std::string errs;
  Json::CharReader* reader(b.newCharReader());
  {
    char const doc[] = "{'a':true,\"b\":true}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_EQUAL(true, root.get("a", false));
    JSONTEST_ASSERT_EQUAL(true, root.get("b", false));
  }
  {
    char const doc[] = "{'a': 'x', \"b\":'y'}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_STRING_EQUAL("x", root["a"].asString());
    JSONTEST_ASSERT_STRING_EQUAL("y", root["b"].asString());
  }
}